

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

uint64_t llvm::hashing::detail::get_execution_seed(void)

{
  int iVar1;
  
  if (get_execution_seed()::seed == '\0') {
    iVar1 = __cxa_guard_acquire(&get_execution_seed()::seed);
    if (iVar1 != 0) {
      get_execution_seed::seed = 0xff51afd7ed558ccd;
      if (fixed_seed_override != 0) {
        get_execution_seed::seed = fixed_seed_override;
      }
      __cxa_guard_release(&get_execution_seed()::seed);
    }
  }
  return get_execution_seed::seed;
}

Assistant:

inline uint64_t get_execution_seed() {
  // FIXME: This needs to be a per-execution seed. This is just a placeholder
  // implementation. Switching to a per-execution seed is likely to flush out
  // instability bugs and so will happen as its own commit.
  //
  // However, if there is a fixed seed override set the first time this is
  // called, return that instead of the per-execution seed.
  const uint64_t seed_prime = 0xff51afd7ed558ccdULL;
  static uint64_t seed = fixed_seed_override ? fixed_seed_override : seed_prime;
  return seed;
}